

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junit_log_formatter.hpp
# Opt level: O2

void __thiscall
boost::unit_test::output::junit_log_formatter::~junit_log_formatter(junit_log_formatter *this)

{
  (this->super_unit_test_log_formatter)._vptr_unit_test_log_formatter =
       (_func_int **)&PTR__junit_log_formatter_001df8a8;
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
            (&(this->list_path_to_root).
              super__List_base<unsigned_long,_std::allocator<unsigned_long>_>);
  junit_impl::junit_log_helper::~junit_log_helper(&this->runner_log_entry);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>,_std::_Select1st<std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>_>_>
  ::~_Rb_tree(&(this->map_tests)._M_t);
  return;
}

Assistant:

junit_log_formatter() : m_display_build_info(false)
    {
        // we log everything from the logger singleton point of view
        // because we need to know about all the messages/commands going to the logger
        // we decide what we put inside the logs internally
        this->m_log_level = log_successful_tests;
        m_log_level_internal = log_messages;
    }